

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mesh_edgebreaker_traversal_predictive_decoder.h
# Opt level: O3

void __thiscall
draco::MeshEdgebreakerTraversalPredictiveDecoder::MeshEdgebreakerTraversalPredictiveDecoder
          (MeshEdgebreakerTraversalPredictiveDecoder *this)

{
  MeshEdgebreakerTraversalDecoder::MeshEdgebreakerTraversalDecoder
            (&this->super_MeshEdgebreakerTraversalDecoder);
  this->corner_table_ = (CornerTable *)0x0;
  this->num_vertices_ = 0;
  (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vertex_valences_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  RAnsBitDecoder::RAnsBitDecoder(&this->prediction_decoder_);
  this->last_symbol_ = -1;
  this->predicted_symbol_ = -1;
  return;
}

Assistant:

MeshEdgebreakerTraversalPredictiveDecoder()
      : corner_table_(nullptr),
        num_vertices_(0),
        last_symbol_(-1),
        predicted_symbol_(-1) {}